

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::GetTerminalAttribute
               (Stage *stage,Attribute *attr,string *attr_name,Attribute *value,string *err)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 prim;
  bool bVar3;
  ostream *poVar4;
  const_iterator cVar5;
  Attribute *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  targetPrimRet;
  string abs_path;
  string targetPrimPropName;
  string targetPrimPath;
  value_type target;
  ostringstream ss_e;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> pv;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  visited_paths;
  undefined1 local_3a8 [16];
  undefined1 local_398 [56];
  string local_360;
  string local_340;
  string local_320;
  Path local_300;
  fmt local_230 [16];
  size_type local_220 [2];
  string local_210;
  undefined1 local_1f0 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140 [12];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  if (value == (Attribute *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"GetTerminalAttribute",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1f0,0xb22);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"`value` arg is nullptr.",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_300._prim_part._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._prim_part._M_dataplus._M_p != &local_300._prim_part.field_2) {
        operator_delete(local_300._prim_part._M_dataplus._M_p,
                        local_300._prim_part.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
    ::std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
    return false;
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  args = value;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  bVar3 = Attribute::is_connection(attr);
  if (!bVar3) {
    ::std::__cxx11::string::_M_assign((string *)value);
    value->_varying_authored = attr->_varying_authored;
    value->_variability = attr->_variability;
    ::std::__cxx11::string::_M_assign((string *)&value->_type_name);
    linb::any::operator=((any *)&value->_var,(any *)&attr->_var);
    (value->_var)._blocked = (attr->_var)._blocked;
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::operator=(&(value->_var)._ts._samples,&(attr->_var)._ts._samples);
    (value->_var)._ts._dirty = (attr->_var)._ts._dirty;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&value->_paths,&attr->_paths);
    AttrMetas::operator=(&value->_metas,&attr->_metas);
    bVar3 = true;
    goto LAB_00343bee;
  }
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&local_78,&attr->_paths);
  if (local_78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,"GetTerminalAttribute",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1f0,0xb2b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    local_3a8._0_8_ = local_398;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3a8,"Connection targetPath is empty for Attribute {}.","");
    fmt::format<std::__cxx11::string>
              ((string *)&local_300,(fmt *)local_3a8,(string *)attr_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1f0,local_300._prim_part._M_dataplus._M_p,
                        local_300._prim_part._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
LAB_003434f6:
    paVar2 = &local_300._prim_part.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._prim_part._M_dataplus._M_p != paVar2) {
      operator_delete(local_300._prim_part._M_dataplus._M_p,
                      local_300._prim_part.field_2._M_allocated_capacity + 1);
    }
    if ((Prim *)local_3a8._0_8_ != (Prim *)local_398) {
      operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_300._prim_part._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._prim_part._M_dataplus._M_p != paVar2) {
        operator_delete(local_300._prim_part._M_dataplus._M_p,
                        local_300._prim_part.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
    ::std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
    bVar3 = false;
  }
  else {
    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (((long)local_78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * 0x4ec4ec4ec4ec4ec5);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1 < args_00) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"GetTerminalAttribute",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1f0,0xb30);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      local_3a8._0_8_ = local_398;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"Multiple targetPaths assigned to .connection.","");
      fmt::format(&local_300._prim_part,(string *)local_3a8);
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,local_300._prim_part._M_dataplus._M_p,
                          local_300._prim_part._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      goto LAB_003434f6;
    }
    Path::Path(&local_300,
               local_78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
               super__Vector_impl_data._M_start);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,local_300._prim_part._M_dataplus._M_p,
               local_300._prim_part._M_string_length + local_300._prim_part._M_dataplus._M_p);
    local_360._M_dataplus._M_p = local_398 + 0x48;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_398 + 0x38),local_300._prop_part._M_dataplus._M_p,
               (undefined1 *)
               (local_300._prop_part._M_string_length + (long)local_300._prop_part._M_dataplus._M_p)
              );
    local_398._24_8_ = local_398 + 0x28;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)(local_398 + 0x18),"");
    Path::Path((Path *)local_1f0,&local_320,(string *)(local_398 + 0x18));
    Stage::GetPrimAtPath_abi_cxx11_
              ((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_3a8,stage,(Path *)local_1f0);
    if (local_150._M_p != local_1f0 + 0xb0) {
      operator_delete(local_150._M_p,local_140[0]._0_8_ + 1);
    }
    if (local_170._M_p != local_1f0 + 0x90) {
      operator_delete(local_170._M_p,local_160._0_8_ + 1);
    }
    if ((undefined1 *)local_1f0._96_8_ != local_1f0 + 0x70) {
      operator_delete((void *)local_1f0._96_8_,local_180._0_8_ + 1);
    }
    if ((undefined1 *)local_1f0._64_8_ != local_1f0 + 0x50) {
      operator_delete((void *)local_1f0._64_8_,local_1f0._80_8_ + 1);
    }
    if ((undefined1 *)local_1f0._32_8_ != local_1f0 + 0x30) {
      operator_delete((void *)local_1f0._32_8_,local_1f0._48_8_ + 1);
    }
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    if ((undefined1 *)local_398._24_8_ != local_398 + 0x28) {
      operator_delete((void *)local_398._24_8_,local_398._40_8_ + 1);
    }
    prim = local_3a8._0_8_;
    if (local_398[0x10] == '\x01') {
      Path::full_path_name_abi_cxx11_((string *)(local_398 + 0x18),&local_300);
      cVar5 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_60,(string *)(local_398 + 0x18));
      if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
        ::std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_398 + 0x18));
        bVar3 = anon_unknown_6::GetTerminalAttributeImpl
                          (stage,(Prim *)prim,(string *)(local_398 + 0x38),value,err,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_60);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1f0,"GetTerminalAttribute",0x14);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1f0,0xb46);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        local_230._0_8_ = local_220;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_230,"Circular referencing detected. connectionTargetPath = {}",""
                  );
        tinyusdz::to_string_abi_cxx11_
                  (&local_210,(tinyusdz *)&local_300,(Path *)0x1,SUB81(args_00,0));
        fmt::format<std::__cxx11::string>(&local_340,local_230,(string *)&local_210,args_00);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1f0,local_340._M_dataplus._M_p,
                            local_340._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((size_type *)local_230._0_8_ != local_220) {
          operator_delete((void *)local_230._0_8_,local_220[0] + 1);
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_340._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
        ::std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
        bVar3 = false;
      }
      if ((undefined1 *)local_398._24_8_ != local_398 + 0x28) {
        operator_delete((void *)local_398._24_8_,local_398._40_8_ + 1);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,"GetTerminalAttribute",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"():",3);
      poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1f0,0xb4e);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      if (local_398[0x10] == '\x01') {
        __assert_fail("! has_value()",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                      ,0x881,
                      "error_type &nonstd::expected_lite::expected<const tinyusdz::Prim *, std::basic_string<char>>::error() & [T = const tinyusdz::Prim *, E = std::basic_string<char>]"
                     );
      }
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1f0,(char *)local_3a8._0_8_,local_3a8._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,local_398._24_8_);
        if ((undefined1 *)local_398._24_8_ != local_398 + 0x28) {
          operator_delete((void *)local_398._24_8_,local_398._40_8_ + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
      ::std::ios_base::~ios_base((ios_base *)(local_1f0 + 0x70));
      bVar3 = false;
    }
    if ((local_398[0x10] == '\0') && ((Prim *)local_3a8._0_8_ != (Prim *)local_398)) {
      operator_delete((void *)local_3a8._0_8_,(ulong)(local_398._0_8_ + 1));
    }
    if (local_360._M_dataplus._M_p != local_398 + 0x48) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._element._M_dataplus._M_p != &local_300._element.field_2) {
      operator_delete(local_300._element._M_dataplus._M_p,local_300._element.field_2._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._variant_part_str._M_dataplus._M_p != &local_300._variant_part_str.field_2) {
      operator_delete(local_300._variant_part_str._M_dataplus._M_p,
                      local_300._variant_part_str.field_2._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._variant_selection_part._M_dataplus._M_p !=
        &local_300._variant_selection_part.field_2) {
      operator_delete(local_300._variant_selection_part._M_dataplus._M_p,
                      local_300._variant_selection_part.field_2._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._variant_part._M_dataplus._M_p != &local_300._variant_part.field_2) {
      operator_delete(local_300._variant_part._M_dataplus._M_p,
                      local_300._variant_part.field_2._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._prop_part._M_dataplus._M_p != &local_300._prop_part.field_2) {
      operator_delete(local_300._prop_part._M_dataplus._M_p,
                      local_300._prop_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._prim_part._M_dataplus._M_p != &local_300._prim_part.field_2) {
      operator_delete(local_300._prim_part._M_dataplus._M_p,
                      local_300._prim_part.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_78);
LAB_00343bee:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar3;
}

Assistant:

bool GetTerminalAttribute(const tinyusdz::Stage &stage,
                          const tinyusdz::Attribute &attr,
                          const std::string &attr_name, Attribute *value,
                          std::string *err) {
  if (!value) {
    PUSH_ERROR_AND_RETURN("`value` arg is nullptr.");
  }

  std::set<std::string> visited_paths;

  if (attr.is_connection()) {
    std::vector<Path> pv = attr.connections();
    if (pv.empty()) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Connection targetPath is empty for Attribute {}.", attr_name));
    }

    if (pv.size() > 1) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Multiple targetPaths assigned to .connection."));
    }

    auto target = pv[0];

    std::string targetPrimPath = target.prim_part();
    std::string targetPrimPropName = target.prop_part();
    DCOUT("connection targetPath : " << target << "(Prim: " << targetPrimPath
                                     << ", Prop: " << targetPrimPropName
                                     << ")");

    auto targetPrimRet =
        stage.GetPrimAtPath(Path(targetPrimPath, /* prop */ ""));
    if (targetPrimRet) {
      // Follow the connetion
      const Prim *targetPrim = targetPrimRet.value();

      std::string abs_path = target.full_path_name();

      if (visited_paths.count(abs_path)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Circular referencing detected. connectionTargetPath = {}",
            to_string(target)));
      }
      visited_paths.insert(abs_path);

      return GetTerminalAttributeImpl(stage, *targetPrim, targetPrimPropName,
                                      value, err, visited_paths);

    } else {
      PUSH_ERROR_AND_RETURN(targetPrimRet.error());
    }

  } else {
    (*value) = attr;
    return true;
  }

  return false;
}